

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O1

BOOL __thiscall LASquadtree::manage_cell(LASquadtree *this,U32 cell_index,BOOL finalize)

{
  byte bVar1;
  byte bVar2;
  U32 *pUVar3;
  uint uVar4;
  U32 UVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  U32 *pUVar9;
  uint uVar10;
  uint uVar11;
  
  uVar11 = cell_index >> 5;
  uVar4 = this->adaptive_alloc;
  if (uVar11 < uVar4) goto LAB_00123cb2;
  if (this->adaptive == (U32 *)0x0) {
    uVar10 = uVar11 + 1;
    pUVar3 = (U32 *)malloc((ulong)(uVar11 * 4 + 4));
    this->adaptive = pUVar3;
    if (uVar4 <= uVar11) {
      pUVar3 = pUVar3 + uVar4;
      uVar4 = uVar11 - uVar4;
      goto LAB_00123c9a;
    }
  }
  else {
    uVar10 = uVar11 * 2;
    pUVar3 = (U32 *)realloc_las(this->adaptive,(ulong)(uVar11 * 8));
    this->adaptive = pUVar3;
    uVar4 = this->adaptive_alloc;
    if (uVar4 < uVar10) {
      pUVar3 = pUVar3 + uVar4;
      uVar4 = ~uVar4 + uVar10;
LAB_00123c9a:
      memset(pUVar3,0,(ulong)uVar4 * 4 + 4);
    }
  }
  this->adaptive_alloc = uVar10;
LAB_00123cb2:
  pUVar3 = this->adaptive;
  pUVar3[uVar11] = pUVar3[uVar11] & ~(1 << ((byte)cell_index & 0x1f));
  uVar7 = 0;
  bVar2 = 0xfc;
  do {
    bVar1 = bVar2;
    uVar8 = uVar7;
    uVar7 = uVar8 + 1;
    bVar2 = bVar1 + 2;
  } while (this->level_offset[uVar8 + 1] <= cell_index);
  if (this->sub_level == 0) {
    UVar5 = this->level_offset[uVar8 & 0xffffffff];
  }
  else {
    UVar5 = (this->sub_level_index << (bVar1 + 4 & 0x1f)) +
            this->level_offset[(this->sub_level + (int)uVar7) - 1];
  }
  if (uVar7 != 1) {
    uVar8 = uVar8 - 1;
    uVar4 = cell_index - UVar5;
    pUVar9 = this->level_offset + (uVar8 & 0xffffffff);
    do {
      uVar4 = uVar4 >> 2;
      iVar6 = (int)uVar8;
      if (this->sub_level == 0) {
        uVar11 = *pUVar9 + uVar4;
      }
      else {
        uVar11 = (this->sub_level_index << (bVar2 & 0x1f)) + uVar4 +
                 this->level_offset[this->sub_level + iVar6];
      }
      if ((pUVar3[uVar11 >> 5] >> (uVar11 & 0x1f) & 1) != 0) {
        return true;
      }
      pUVar3[uVar11 >> 5] = 1 << ((byte)uVar11 & 0x1f) | pUVar3[uVar11 >> 5];
      pUVar9 = pUVar9 + -1;
      bVar2 = bVar2 - 2;
      uVar8 = (ulong)(iVar6 - 1);
    } while (iVar6 != 0);
  }
  return true;
}

Assistant:

BOOL LASquadtree::manage_cell(const U32 cell_index, const BOOL finalize)
{
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  if (adaptive_pos >= adaptive_alloc)
  {
    if (adaptive)
    {
      adaptive = (U32*)realloc_las(adaptive, adaptive_pos*2*sizeof(U32));
      for (U32 i = adaptive_alloc; i < adaptive_pos*2; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos*2;
    }
    else
    {
#pragma warning(push)
#pragma warning(disable : 6011)
      adaptive = (U32*)malloc((adaptive_pos+1)*sizeof(U32));
      for (U32 i = adaptive_alloc; i <= adaptive_pos; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos+1;
#pragma warning(pop)
    }
  }
  adaptive[adaptive_pos] &= ~adaptive_bit;
  U32 index;
  U32 level = get_level(cell_index);
  U32 level_index = get_level_index(cell_index, level);
  while (level)
  {
    level--;
    level_index = level_index >> 2;
    index = get_cell_index(level_index, level);
    adaptive_pos = index/32;
    adaptive_bit = ((U32)1) << (index%32);
    if (adaptive[adaptive_pos] & adaptive_bit) break;
    adaptive[adaptive_pos] |= adaptive_bit;
  }
  return TRUE;
}